

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::~IfcFaceBound(IfcFaceBound *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  plVar1 = (long *)((this->Orientation).field_2._M_local_buf + (long)p_Var2);
  plVar1[-9] = (long)&PTR__IfcFaceBound_00875540;
  plVar1[2] = (long)&PTR__IfcFaceBound_008755b8;
  plVar1[-7] = (long)&PTR__IfcFaceBound_00875568;
  plVar1[-5] = (long)&PTR__IfcFaceBound_00875590;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem
                          .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2),0x70);
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}